

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
::
binary_search<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
           *this,SymbolEntry *k,checked_compare *comp)

{
  field_type fVar1;
  field_type fVar2;
  SearchResult<unsigned_long,_false> SVar3;
  
  fVar1 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          ::start((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                   *)this);
  fVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          ::finish((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                    *)this);
  SVar3 = binary_search_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare>
                    (this,k,fVar1,fVar2,comp);
  return (SearchResult<unsigned_long,_false>)SVar3.value;
}

Assistant:

SearchResult<size_type, btree_is_key_compare_to<Compare, key_type>::value>
  binary_search(const K &k, const Compare &comp) const {
    return binary_search_impl(k, start(), finish(), comp,
                              btree_is_key_compare_to<Compare, key_type>());
  }